

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLLoader.cpp
# Opt level: O0

void __thiscall Assimp::MDLImporter::SetupMaterialProperties_3DGS_MDL5_Quake1(MDLImporter *this)

{
  aiTexture *this_00;
  aiTexture **ppaVar1;
  undefined4 in;
  undefined1 auVar2 [8];
  bool bVar3;
  aiMaterial **ppaVar4;
  aiMaterial *this_01;
  aiColor4D aVar5;
  undefined1 local_454 [8];
  aiString szString;
  float local_48;
  float fStack_44;
  undefined1 local_40 [8];
  aiColor4D clr;
  aiMaterial *pcHelper;
  int iMode;
  uchar *local_18;
  Header *pcHeader;
  MDLImporter *this_local;
  
  local_18 = this->mBuffer;
  pcHeader = (Header *)this;
  ppaVar4 = (aiMaterial **)operator_new__(8);
  this->pScene->mMaterials = ppaVar4;
  this_01 = (aiMaterial *)operator_new(0x10);
  aiMaterial::aiMaterial(this_01);
  *this->pScene->mMaterials = this_01;
  this->pScene->mNumMaterials = 1;
  pcHelper._0_4_ = 2;
  clr._8_8_ = *this->pScene->mMaterials;
  aiMaterial::AddProperty<int>((aiMaterial *)clr._8_8_,(int *)&pcHelper,1,"$mat.shadingm",0,0);
  aiColor4t<float>::aiColor4t((aiColor4t<float> *)local_40);
  if ((*(int *)(local_18 + 0x30) != 0) && (this->pScene->mNumTextures != 0)) {
    aVar5 = ReplaceTextureWithColor(this,*this->pScene->mTextures);
    szString.data._1016_8_ = aVar5._0_8_;
    local_40[0] = szString.data[0x3f8];
    local_40[1] = szString.data[0x3f9];
    local_40[2] = szString.data[0x3fa];
    local_40[3] = szString.data[0x3fb];
    local_40[4] = szString.data[0x3fc];
    local_40[5] = szString.data[0x3fd];
    local_40[6] = szString.data[0x3fe];
    local_40[7] = szString.data[0x3ff];
    auVar2 = local_40;
    _local_48 = aVar5._8_8_;
    clr.r = local_48;
    clr.g = fStack_44;
    local_40._0_4_ = aVar5.r;
    in = local_40._0_4_;
    unique0x10000283 = aVar5;
    local_40 = auVar2;
    bVar3 = is_not_qnan<float>((float)in);
    if (bVar3) {
      this_00 = *this->pScene->mTextures;
      if (this_00 != (aiTexture *)0x0) {
        aiTexture::~aiTexture(this_00);
        operator_delete(this_00,0x428);
      }
      ppaVar1 = this->pScene->mTextures;
      if (ppaVar1 != (aiTexture **)0x0) {
        operator_delete__(ppaVar1);
      }
      this->pScene->mTextures = (aiTexture **)0x0;
      this->pScene->mNumTextures = 0;
    }
    else {
      local_40._0_4_ = 1.0;
      local_40._4_4_ = 1.0;
      clr.r = 1.0;
      clr.g = 1.0;
      aiString::aiString((aiString *)local_454);
      local_454[4] = '*';
      local_454[5] = '0';
      local_454[6] = '\0';
      local_454._0_4_ = 2;
      aiMaterial::AddProperty((aiMaterial *)clr._8_8_,(aiString *)local_454,"$tex.file",1,0);
    }
  }
  aiMaterial::AddProperty<aiColor4t<float>>
            ((aiMaterial *)clr._8_8_,(aiColor4D *)local_40,1,"$clr.diffuse",0,0);
  aiMaterial::AddProperty<aiColor4t<float>>
            ((aiMaterial *)clr._8_8_,(aiColor4D *)local_40,1,"$clr.specular",0,0);
  local_40._4_4_ = (float)local_40._4_4_ * 0.05;
  local_40._0_4_ = (float)local_40._0_4_ * 0.05;
  clr.g = 1.0;
  clr.r = clr.r * 0.05;
  aiMaterial::AddProperty<aiColor4t<float>>
            ((aiMaterial *)clr._8_8_,(aiColor4D *)local_40,1,"$clr.ambient",0,0);
  return;
}

Assistant:

void MDLImporter::SetupMaterialProperties_3DGS_MDL5_Quake1( )
{
    const MDL::Header* const pcHeader = (const MDL::Header*)this->mBuffer;

    // allocate ONE material
    pScene->mMaterials    = new aiMaterial*[1];
    pScene->mMaterials[0] = new aiMaterial();
    pScene->mNumMaterials = 1;

    // setup the material's properties
    const int iMode = (int)aiShadingMode_Gouraud;
    aiMaterial* const pcHelper = (aiMaterial*)pScene->mMaterials[0];
    pcHelper->AddProperty<int>(&iMode, 1, AI_MATKEY_SHADING_MODEL);

    aiColor4D clr;
    if (0 != pcHeader->num_skins && pScene->mNumTextures)   {
        // can we replace the texture with a single color?
        clr = this->ReplaceTextureWithColor(pScene->mTextures[0]);
        if (is_not_qnan(clr.r)) {
            delete pScene->mTextures[0];
            delete[] pScene->mTextures;

            pScene->mTextures = NULL;
            pScene->mNumTextures = 0;
        }
        else    {
            clr.b = clr.a = clr.g = clr.r = 1.0f;
            aiString szString;
            ::memcpy(szString.data,AI_MAKE_EMBEDDED_TEXNAME(0),3);
            szString.length = 2;
            pcHelper->AddProperty(&szString,AI_MATKEY_TEXTURE_DIFFUSE(0));
        }
    }

    pcHelper->AddProperty<aiColor4D>(&clr, 1,AI_MATKEY_COLOR_DIFFUSE);
    pcHelper->AddProperty<aiColor4D>(&clr, 1,AI_MATKEY_COLOR_SPECULAR);

    clr.r *= 0.05f;clr.g *= 0.05f;
    clr.b *= 0.05f;clr.a  = 1.0f;
    pcHelper->AddProperty<aiColor4D>(&clr, 1,AI_MATKEY_COLOR_AMBIENT);
}